

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

bool __thiscall
glcts::StateInteractionCase::checkCSProg
          (StateInteractionCase *this,Functions *gl,GLuint program,int expectedLink)

{
  bool local_31;
  GLint local_24;
  int local_20;
  int linked;
  int expectedLink_local;
  GLuint program_local;
  Functions *gl_local;
  StateInteractionCase *this_local;
  
  local_24 = 0;
  local_20 = expectedLink;
  linked = program;
  if (((program != 0) &&
      (_expectedLink_local = gl, gl_local = (Functions *)this,
      (*gl->getProgramiv)(program,0x8b82,&local_24), local_20 != 0)) && (local_24 == 0)) {
    logProgramInfoLog(this,_expectedLink_local,linked);
  }
  local_31 = linked != 0 && local_24 == local_20;
  return local_31;
}

Assistant:

bool checkCSProg(const glw::Functions& gl, GLuint program, int expectedLink = GL_TRUE)
	{
		int linked = GL_FALSE;
		if (program != 0)
		{
			gl.getProgramiv(program, GL_LINK_STATUS, &linked);

			if (expectedLink && !linked)
			{
				logProgramInfoLog(gl, program);
			}
		}

		return (program != 0) && (linked == expectedLink);
	}